

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockReturnValueTest.cpp
# Opt level: O0

void __thiscall
TEST_MockReturnValueTest_PointerReturnValue_Test::~TEST_MockReturnValueTest_PointerReturnValue_Test
          (TEST_MockReturnValueTest_PointerReturnValue_Test *this)

{
  TEST_MockReturnValueTest_PointerReturnValue_Test *this_local;
  
  ~TEST_MockReturnValueTest_PointerReturnValue_Test(this);
  operator_delete(this,8);
  return;
}

Assistant:

TEST(MockReturnValueTest, PointerReturnValue)
{
    void* ptr = (void*) 0x00107;
    mock().expectOneCall("foo").andReturnValue(ptr);
    MockActualCall& actual_call = mock().actualCall("foo");

    POINTERS_EQUAL(ptr, actual_call.returnValue().getPointerValue());
    POINTERS_EQUAL(ptr, actual_call.returnPointerValue());
    POINTERS_EQUAL(ptr, mock().pointerReturnValue());
}